

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.h
# Opt level: O3

void clause_unwatch(solver_t *s,uint cref)

{
  vec_wl_t *pvVar1;
  uint *puVar2;
  watch_list *pwVar3;
  watcher *pwVar4;
  watcher wVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  pvVar1 = s->watches;
  puVar2 = s->all_clauses->data;
  uVar8 = (ulong)puVar2[(ulong)cref + 2] ^ 1;
  if ((uint)uVar8 < pvVar1->cap) {
    if ((uint)uVar8 < pvVar1->size) {
      pwVar3 = pvVar1->watch_lists;
      pwVar4 = pwVar3[uVar8].watchers;
      if (puVar2[(ulong)cref + 1] == 2) {
        uVar6 = 0;
        do {
          uVar7 = uVar6;
          uVar6 = uVar7 + 1;
        } while (pwVar4[uVar7].cref != cref);
        if (pwVar3[uVar8].size <= uVar7) goto LAB_0055db9a;
        pwVar3[uVar8].n_bin = pwVar3[uVar8].n_bin - 1;
        memmove(pwVar4 + uVar7,pwVar4 + (ulong)uVar7 + 1,
                (ulong)(pwVar3[uVar8].size - (uVar7 + 1)) << 3);
      }
      else {
        uVar6 = pwVar3[uVar8].n_bin;
        do {
          uVar7 = uVar6;
          uVar6 = uVar7 + 1;
        } while (pwVar4[uVar7].cref != cref);
        if (pwVar3[uVar8].size <= uVar7) goto LAB_0055dbb9;
        wVar5 = pwVar4[uVar7];
        pwVar4[uVar7] = pwVar4[pwVar3[uVar8].size - 1];
        pwVar3[uVar8].watchers[pwVar3[uVar8].size - 1] = wVar5;
      }
      pwVar3[uVar8].size = pwVar3[uVar8].size - 1;
      pvVar1 = s->watches;
      uVar8 = (ulong)puVar2[(ulong)cref + 3] ^ 1;
      if (pvVar1->cap <= (uint)uVar8) goto LAB_0055db5c;
      if ((uint)uVar8 < pvVar1->size) {
        pwVar3 = pvVar1->watch_lists;
        pwVar4 = pwVar3[uVar8].watchers;
        if (puVar2[(ulong)cref + 1] == 2) {
          uVar6 = 0;
          do {
            uVar7 = uVar6;
            uVar6 = uVar7 + 1;
          } while (pwVar4[uVar7].cref != cref);
          if (pwVar3[uVar8].size <= uVar7) {
LAB_0055db9a:
            __assert_fail("i < watch_list_size(wl)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/watch_list.h"
                          ,0x6f,
                          "void watch_list_remove(struct watch_list *, unsigned int, unsigned int)")
            ;
          }
          pwVar3[uVar8].n_bin = pwVar3[uVar8].n_bin - 1;
          memmove(pwVar4 + uVar7,pwVar4 + (ulong)uVar7 + 1,
                  (ulong)(pwVar3[uVar8].size - (uVar7 + 1)) << 3);
        }
        else {
          uVar6 = pwVar3[uVar8].n_bin;
          do {
            uVar7 = uVar6;
            uVar6 = uVar7 + 1;
          } while (pwVar4[uVar7].cref != cref);
          if (pwVar3[uVar8].size <= uVar7) {
LAB_0055dbb9:
            __assert_fail("i < watch_list_size(wl)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/watch_list.h"
                          ,0x75,
                          "void watch_list_remove(struct watch_list *, unsigned int, unsigned int)")
            ;
          }
          wVar5 = pwVar4[uVar7];
          pwVar4[uVar7] = pwVar4[pwVar3[uVar8].size - 1];
          pwVar3[uVar8].watchers[pwVar3[uVar8].size - 1] = wVar5;
        }
        pwVar3[uVar8].size = pwVar3[uVar8].size - 1;
        return;
      }
    }
    __assert_fail("idx < vec_wl->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/watch_list.h"
                  ,0xc6,"struct watch_list *vec_wl_at(vec_wl_t *, unsigned int)");
  }
LAB_0055db5c:
  __assert_fail("idx < vec_wl->cap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/watch_list.h"
                ,0xc5,"struct watch_list *vec_wl_at(vec_wl_t *, unsigned int)");
}

Assistant:

static inline void clause_unwatch(solver_t *s, unsigned cref)
{
    struct clause *clause = cdb_handler(s->all_clauses, cref);
    watch_list_remove(vec_wl_at(s->watches, lit_compl(clause->data[0].lit)), cref, (clause->size == 2));
    watch_list_remove(vec_wl_at(s->watches, lit_compl(clause->data[1].lit)), cref, (clause->size == 2));
}